

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  char *pcVar3;
  char **argv_local;
  int argc_local;
  
  tVar2 = time((time_t *)0x0);
  srandom((uint)tVar2);
  memset(&greatest_info,0,0x170);
  greatest_info.width = 0x48;
  greatest_info.begin = clock();
  if (greatest_info.begin == -1) {
    fprintf(_stdout,"clock error: %s\n","greatest_info.begin");
    exit(1);
  }
  greatest_parse_args(argc,argv);
  greatest_run_suite(generic_pack_unpack_le,"generic_pack_unpack_le");
  greatest_run_suite(generic_pack_unpack_be,"generic_pack_unpack_be");
  greatest_run_suite(generic_mixed_endian,"generic_mixed_endian");
  greatest_run_suite(plan,"plan");
  if ((greatest_info.flags & 2) == 0) {
    update_counts_and_reset_suite();
    greatest_info.end = clock();
    if (greatest_info.end == -1) {
      fprintf(_stdout,"clock error: %s\n","greatest_info.end");
      exit(1);
    }
    pcVar3 = "s";
    if (greatest_info.tests_run == 1) {
      pcVar3 = "";
    }
    fprintf(_stdout,"\nTotal: %u test%s",(ulong)greatest_info.tests_run,pcVar3);
    fprintf(_stdout," (%lu ticks, %.3f sec)",
            (double)(greatest_info.end - greatest_info.begin) / 1000000.0,
            greatest_info.end - greatest_info.begin);
    pcVar3 = "s";
    if (greatest_info.assertions == 1) {
      pcVar3 = "";
    }
    fprintf(_stdout,", %u assertion%s\n",(ulong)greatest_info.assertions,pcVar3);
    fprintf(_stdout,"Pass: %u, fail: %u, skip: %u.\n",(ulong)greatest_info.passed,
            (ulong)greatest_info.failed,(ulong)greatest_info.skipped);
  }
  iVar1 = greatest_all_passed();
  return (uint)(iVar1 == 0);
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}